

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  TestCase *pTVar1;
  TestCase *__v;
  pair<std::_Rb_tree_iterator<Catch::TestCase>,_bool> pVar2;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  ReusableStringStream RStack_88;
  string local_70;
  _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  local_50;
  
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  __v = (functions->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pTVar1 = (functions->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__v != pTVar1) {
    do {
      pVar2 = std::
              _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
              ::_M_insert_unique<Catch::TestCase_const&>
                        ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                          *)&local_50,__v);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        ReusableStringStream::ReusableStringStream(&RStack_88);
        std::__ostream_insert<char,std::char_traits<char>>
                  (RStack_88.m_oss,"error: TEST_CASE( \"",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (RStack_88.m_oss,(__v->super_TestCaseInfo).name._M_dataplus._M_p,
                   (__v->super_TestCaseInfo).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (RStack_88.m_oss,"\" ) already defined.\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(RStack_88.m_oss,"\tFirst seen at ",0xf);
        operator<<(RStack_88.m_oss,(SourceLineInfo *)&pVar2.first._M_node._M_node[5]._M_left);
        std::__ostream_insert<char,std::char_traits<char>>(RStack_88.m_oss,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(RStack_88.m_oss,"\tRedefined at ",0xe);
        operator<<(RStack_88.m_oss,&(__v->super_TestCaseInfo).lineInfo);
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_70);
      }
      __v = __v + 1;
    } while (__v != pTVar1);
  }
  std::
  _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

constexpr auto isNullTerminated() const noexcept -> bool {
            return m_start[m_size] == '\0';
        }